

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O0

void __thiscall
Apple::Macintosh::Audio::apply_samples<(Outputs::Speaker::Action)0>
          (Audio *this,size_t number_of_samples,MonoSample *target)

{
  short sVar1;
  size_t sVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  size_type sVar6;
  unsigned_long uStack_48;
  int16_t output_level;
  unsigned_long local_40;
  unsigned_long cycles_left_in_sample;
  MonoSample *target_local;
  size_t number_of_samples_local;
  Audio *this_local;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  cycles_left_in_sample = (unsigned_long)target;
  number_of_samples_local = (size_t)this;
  for (target_local = (MonoSample *)number_of_samples; target_local != (MonoSample *)0x0;
      target_local = (MonoSample *)((long)target_local - local_40)) {
    uStack_48 = 0xb0 - this->subcycle_offset_;
    puVar4 = std::min<unsigned_long>((unsigned_long *)&target_local,&stack0xffffffffffffffb8);
    local_40 = *puVar4;
    sVar1 = this->volume_multiplier_;
    pvVar5 = std::array<std::atomic<unsigned_char>,_740UL>::operator[]
                       (&(this->sample_queue_).buffer,(this->sample_queue_).read_pointer);
    local_14 = 0;
    ___b = pvVar5;
    local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_14 - 1U < 2) {
      this_local._7_1_ = (pvVar5->super___atomic_base<unsigned_char>)._M_i;
    }
    else if (local_14 == 5) {
      this_local._7_1_ = (pvVar5->super___atomic_base<unsigned_char>)._M_i;
    }
    else {
      this_local._7_1_ = (pvVar5->super___atomic_base<unsigned_char>)._M_i;
    }
    Outputs::Speaker::fill<(Outputs::Speaker::Action)0,short*,short>
              ((short *)cycles_left_in_sample,(short *)(cycles_left_in_sample + local_40 * 2),
               sVar1 * (this_local._7_1_ - 0x80));
    cycles_left_in_sample = local_40 * 2 + cycles_left_in_sample;
    this->subcycle_offset_ = local_40 + this->subcycle_offset_;
    sVar2 = (this->sample_queue_).read_pointer;
    uVar3 = this->subcycle_offset_;
    sVar6 = std::array<std::atomic<unsigned_char>,_740UL>::size(&(this->sample_queue_).buffer);
    (this->sample_queue_).read_pointer = (sVar2 + uVar3 / 0xb0) % sVar6;
    this->subcycle_offset_ = this->subcycle_offset_ % 0xb0;
  }
  return;
}

Assistant:

void Audio::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	// TODO: the implementation below acts as if the hardware uses pulse-amplitude modulation;
	// in fact it uses pulse-width modulation. But the scale for pulses isn't specified, so
	// that's something to return to.

	while(number_of_samples) {
		// Determine how many output samples will be at the same level.
		const auto cycles_left_in_sample = std::min(number_of_samples, sample_length - subcycle_offset_);

		// Determine the output level, and output that many samples.
		const int16_t output_level = volume_multiplier_ * (int16_t(sample_queue_.buffer[sample_queue_.read_pointer].load(std::memory_order::memory_order_relaxed)) - 128);
		Outputs::Speaker::fill<action>(target, target + cycles_left_in_sample, output_level);
		target += cycles_left_in_sample;

		// Advance the sample pointer.
		subcycle_offset_ += cycles_left_in_sample;
		sample_queue_.read_pointer = (sample_queue_.read_pointer + (subcycle_offset_ / sample_length)) % sample_queue_.buffer.size();
		subcycle_offset_ %= sample_length;

		// Decreate the number of samples left to write.
		number_of_samples -= cycles_left_in_sample;
	}
}